

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O1

void __thiscall
chrono::ChTimestepperEulerImplicitLinearized::Advance
          (ChTimestepperEulerImplicitLinearized *this,double dt)

{
  ChState *pCVar1;
  ChStateDelta *pCVar2;
  double *pdVar3;
  double *pdVar4;
  ChVectorDynamic<> *this_00;
  ChVectorDynamic<> *pCVar5;
  ChVectorDynamic<> *pCVar6;
  undefined1 auVar7 [16];
  ChIntegrable *pCVar8;
  double *pdVar9;
  double *pdVar10;
  ChIntegrable *pCVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  int iVar21;
  Index size;
  Index index;
  ulong uVar22;
  ulong uVar23;
  ActualDstType actualDst_1;
  ulong uVar24;
  long lVar25;
  ActualDstType actualDst;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined8 in_XMM0_Qb;
  ChStateDelta local_d0;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_b8;
  double local_88;
  undefined8 uStack_80;
  double *local_70;
  ChStateDelta *local_68;
  ChState *local_60;
  ChVectorDynamic<> *local_58;
  ChVectorDynamic<> *local_50;
  ChStateDelta local_48;
  
  pCVar8 = (this->super_ChTimestepperIIorder).super_ChTimestepper.integrable;
  pCVar1 = &(this->super_ChTimestepperIIorder).X;
  pCVar2 = &(this->super_ChTimestepperIIorder).V;
  (*pCVar8->_vptr_ChIntegrable[0x15])(pCVar8,pCVar1,pCVar2,&(this->super_ChTimestepperIIorder).A);
  iVar21 = (*pCVar8->_vptr_ChIntegrable[2])(pCVar8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar21
            );
  lVar25 = (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (-1 < lVar25) {
    if (lVar25 != 0) {
      memset((this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,lVar25 << 3);
    }
    pCVar5 = &this->R;
    iVar21 = (*pCVar8->_vptr_ChIntegrable[0x13])(pCVar8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar21)
    ;
    lVar25 = (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (-1 < lVar25) {
      if (lVar25 != 0) {
        memset((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar25 << 3);
      }
      pCVar6 = &this->Qc;
      iVar21 = (*pCVar8->_vptr_ChIntegrable[2])(pCVar8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pCVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)iVar21);
      lVar25 = (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (-1 < lVar25) {
        if (lVar25 != 0) {
          memset((pCVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data,0,lVar25 << 3);
        }
        this_00 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.L;
        local_50 = pCVar6;
        iVar21 = (*pCVar8->_vptr_ChIntegrable[2])(pCVar8);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   (long)iVar21);
        lVar25 = (this->super_ChTimestepperIIorder).super_ChTimestepper.L.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (-1 < lVar25) {
          if (lVar25 != 0) {
            memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data,0,lVar25 << 3);
          }
          local_70 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.T;
          local_58 = pCVar5;
          (*pCVar8->_vptr_ChIntegrable[0x16])(pCVar8,pCVar1,pCVar2);
          (*pCVar8->_vptr_ChIntegrable[8])(pCVar8);
          uVar23 = (this->super_ChTimestepperIIorder).super_ChTimestepper.L.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (-1 < (long)uVar23) {
            pdVar9 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            uVar22 = uVar23 & 0x7ffffffffffffff8;
            auVar26._8_8_ = in_XMM0_Qb;
            auVar26._0_8_ = dt;
            if (7 < (long)uVar23) {
              auVar27 = vbroadcastsd_avx512f(auVar26);
              uVar24 = 0;
              do {
                auVar28 = vmulpd_avx512f(auVar27,*(undefined1 (*) [64])(pdVar9 + uVar24));
                *(undefined1 (*) [64])(pdVar9 + uVar24) = auVar28;
                uVar24 = uVar24 + 8;
              } while (uVar24 < uVar22);
            }
            if ((long)uVar22 < (long)uVar23) {
              do {
                pdVar9[uVar22] = dt * pdVar9[uVar22];
                uVar22 = uVar22 + 1;
              } while (uVar23 != uVar22);
            }
            pdVar9 = (this->super_ChTimestepperIIorder).V.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            uVar23 = (this->super_ChTimestepperIIorder).V.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            local_68 = pCVar2;
            local_60 = pCVar1;
            if ((this->Vold).super_ChVectorDynamic<double>.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                uVar23) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Vold,
                         uVar23,1);
            }
            pCVar5 = local_58;
            pCVar2 = local_68;
            uVar22 = (this->Vold).super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (uVar22 != uVar23) {
              __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                           );
            }
            pdVar10 = (this->Vold).super_ChVectorDynamic<double>.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data;
            uVar23 = uVar22 + 7;
            if (-1 < (long)uVar22) {
              uVar23 = uVar22;
            }
            uVar23 = uVar23 & 0xfffffffffffffff8;
            if (7 < (long)uVar22) {
              lVar25 = 0;
              do {
                pdVar3 = pdVar9 + lVar25;
                dVar13 = pdVar3[1];
                dVar14 = pdVar3[2];
                dVar15 = pdVar3[3];
                dVar16 = pdVar3[4];
                dVar17 = pdVar3[5];
                dVar18 = pdVar3[6];
                dVar19 = pdVar3[7];
                pdVar4 = pdVar10 + lVar25;
                *pdVar4 = *pdVar3;
                pdVar4[1] = dVar13;
                pdVar4[2] = dVar14;
                pdVar4[3] = dVar15;
                pdVar4[4] = dVar16;
                pdVar4[5] = dVar17;
                pdVar4[6] = dVar18;
                pdVar4[7] = dVar19;
                lVar25 = lVar25 + 8;
              } while (lVar25 < (long)uVar23);
            }
            if ((long)uVar23 < (long)uVar22) {
              do {
                pdVar10[uVar23] = pdVar9[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar22 != uVar23);
            }
            (this->Vold).integrable = (this->super_ChTimestepperIIorder).V.integrable;
            (*pCVar8->_vptr_ChIntegrable[0xe])(pCVar8,local_58);
            (*pCVar8->_vptr_ChIntegrable[0x1d])(0x3ff0000000000000,pCVar8,pCVar5,pCVar2);
            pCVar6 = local_50;
            local_88 = 1.0 / dt;
            uStack_80 = 0;
            (*pCVar8->_vptr_ChIntegrable[0x10])
                      (local_88,(this->super_ChTimestepperIIorder).super_ChTimestepper.Qc_clamping,
                       pCVar8,local_50,
                       (ulong)(this->super_ChTimestepperIIorder).super_ChTimestepper.Qc_do_clamp);
            (*pCVar8->_vptr_ChIntegrable[0x11])(0x3ff0000000000000,pCVar8,pCVar6);
            pCVar1 = local_60;
            auVar20._8_8_ = in_XMM0_Qb;
            auVar20._0_8_ = dt;
            auVar12._8_8_ = 0x8000000000000000;
            auVar12._0_8_ = 0x8000000000000000;
            auVar26 = vxorpd_avx512vl(auVar20,auVar12);
            (*pCVar8->_vptr_ChIntegrable[0x1c])
                      (0x3ff0000000000000,auVar26._0_8_,auVar26._0_8_ * dt,
                       dt + (this->super_ChTimestepperIIorder).super_ChTimestepper.T,pCVar8,pCVar2,
                       this_00,pCVar5,pCVar6,local_60,pCVar2,0,0,1);
            uVar23 = (this->super_ChTimestepperIIorder).super_ChTimestepper.L.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (-1 < (long)uVar23) {
              pdVar9 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              uVar22 = uVar23 & 0x7ffffffffffffff8;
              if (7 < (long)uVar23) {
                auVar7._8_8_ = 0;
                auVar7._0_8_ = local_88;
                auVar27 = vbroadcastsd_avx512f(auVar7);
                uVar24 = 0;
                do {
                  auVar28 = vmulpd_avx512f(auVar27,*(undefined1 (*) [64])(pdVar9 + uVar24));
                  *(undefined1 (*) [64])(pdVar9 + uVar24) = auVar28;
                  uVar24 = uVar24 + 8;
                } while (uVar24 < uVar22);
              }
              if ((long)uVar22 < (long)uVar23) {
                do {
                  pdVar9[uVar22] = local_88 * pdVar9[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar23 != uVar22);
              }
              local_b8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data = (double *)0x0;
              local_b8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows = 0;
              local_b8.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data = (this->Vold).super_ChVectorDynamic<double>.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
              local_b8.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_rows.m_value =
                   (this->Vold).super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
              if (local_b8.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_rows.m_value < 0 &&
                  local_b8.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data != (double *)0x0) {
                __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                              ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                              "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                             );
              }
              ChStateDelta::operator-(&local_48,pCVar2,&local_b8);
              ChStateDelta::operator*(&local_d0,&local_48,local_88);
              (*pCVar8->_vptr_ChIntegrable[0x19])(pCVar8,&local_d0);
              if (local_d0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
                  (double *)0x0) {
                free((void *)local_d0.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              if (local_48.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
                  (double *)0x0) {
                free((void *)local_48.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              if (local_b8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data != (double *)0x0) {
                free((void *)local_b8.m_object.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              ChStateDelta::operator*(&local_d0,pCVar2,dt);
              ChState::ChState((ChState *)&local_b8,pCVar1);
              pCVar11 = (this->super_ChTimestepperIIorder).X.integrable;
              (*pCVar11->_vptr_ChIntegrable[0xb])(pCVar11,pCVar1,&local_b8,&local_d0);
              if (local_b8.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data != (double *)0x0) {
                free((void *)local_b8.
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                             .
                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             .m_data[-1]);
              }
              if (local_d0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
                  (double *)0x0) {
                free((void *)local_d0.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              *local_70 = dt + *local_70;
              (*pCVar8->_vptr_ChIntegrable[0x17])(pCVar8,pCVar1,pCVar2,1);
              (*pCVar8->_vptr_ChIntegrable[9])(pCVar8,this_00);
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChTimestepperEulerImplicitLinearized::Advance(const double dt) {
    // downcast
    ChIntegrableIIorder* mintegrable = (ChIntegrableIIorder*)this->integrable;

    // setup main vectors
    mintegrable->StateSetup(X, V, A);

    // setup auxiliary vectors
    Dl.setZero(mintegrable->GetNconstr());
    R.setZero(mintegrable->GetNcoords_v());
    Qc.setZero(mintegrable->GetNconstr());
    L.setZero(mintegrable->GetNconstr());

    mintegrable->StateGather(X, V, T);  // state <- system

    mintegrable->StateGatherReactions(L);  // state <- system (may be needed for warm starting StateSolveCorrection)
    L *= dt;                               // because reactions = forces, here L = impulses

    Vold = V;

    // solve only 1st NR step, using v_new = 0, so  Dv = v_new , therefore
    //
    // [ M - dt*dF/dv - dt^2*dF/dx    Cq' ] [ Dv     ] = [ M*(v_old - v_new) + dt*f]
    // [ Cq                           0   ] [ -dt*Dl ] = [ -C/dt - Ct ]
    //
    // becomes the Anitescu/Trinkle timestepper:
    //
    // [ M - dt*dF/dv - dt^2*dF/dx    Cq' ] [ v_new  ] = [ M*(v_old) + dt*f]
    // [ Cq                           0   ] [ -dt*l  ] = [ -C/dt - Ct ]

    mintegrable->LoadResidual_F(R, dt);
    mintegrable->LoadResidual_Mv(R, V, 1.0);
    mintegrable->LoadConstraint_C(Qc, 1.0 / dt, Qc_do_clamp, Qc_clamping);
    mintegrable->LoadConstraint_Ct(Qc, 1.0);

    mintegrable->StateSolveCorrection(  //
        V, L, R, Qc,                    //
        1.0,                            // factor for  M
        -dt,                            // factor for  dF/dv
        -dt * dt,                       // factor for  dF/dx
        X, V, T + dt,                   // not needed
        false,                          // do not scatter update to Xnew Vnew T+dt before computing correction
        false,                          // full update? (not used, since no scatter)
        true                            // force a call to the solver's Setup() function
    );

    L *= (1.0 / dt);  // Note it is not -(1.0/dt) because we assume StateSolveCorrection already flips sign of Dl

    mintegrable->StateScatterAcceleration(
        (V - Vold) * (1 / dt));  // -> system auxiliary data (i.e acceleration as measure, fits DVI/MDI)

    X += V * dt;

    T += dt;

    mintegrable->StateScatter(X, V, T, true);  // state -> system
    mintegrable->StateScatterReactions(L);     // -> system auxiliary data
}